

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O2

void __thiscall DFraggleThinker::AddRunningScript(DFraggleThinker *this,DRunningScript *runscr)

{
  TObjPtr<DRunningScript> *obj;
  TObjPtr<DRunningScript> *obj_00;
  DRunningScript *pDVar1;
  
  obj = &this->RunningScripts;
  pDVar1 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj);
  obj_00 = &runscr->next;
  (runscr->next).field_0 = (pDVar1->next).field_0;
  pDVar1 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj);
  pDVar1 = GC::ReadBarrier<DRunningScript>((DRunningScript **)&pDVar1->next);
  GC::WriteBarrier(&runscr->super_DObject,&pDVar1->super_DObject);
  (runscr->prev).field_0 = (this->RunningScripts).field_0;
  pDVar1 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj);
  GC::WriteBarrier(&runscr->super_DObject,&pDVar1->super_DObject);
  pDVar1 = GC::ReadBarrier<DRunningScript>((DRunningScript **)&runscr->prev);
  (pDVar1->next).field_0.p = runscr;
  pDVar1 = GC::ReadBarrier<DRunningScript>((DRunningScript **)&runscr->prev);
  GC::WriteBarrier(&pDVar1->super_DObject,&runscr->super_DObject);
  pDVar1 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj_00);
  if (pDVar1 != (DRunningScript *)0x0) {
    pDVar1 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj_00);
    (pDVar1->prev).field_0.p = runscr;
    pDVar1 = GC::ReadBarrier<DRunningScript>((DRunningScript **)obj_00);
    GC::WriteBarrier(&pDVar1->super_DObject,&runscr->super_DObject);
    return;
  }
  return;
}

Assistant:

void DFraggleThinker::AddRunningScript(DRunningScript *runscr)
{
	runscr->next = RunningScripts->next;
	GC::WriteBarrier(runscr, RunningScripts->next);

	runscr->prev = RunningScripts;
	GC::WriteBarrier(runscr, RunningScripts);

	runscr->prev->next = runscr;
	GC::WriteBarrier(runscr->prev, runscr);

	if(runscr->next)
	{
		runscr->next->prev = runscr;
		GC::WriteBarrier(runscr->next, runscr);
	}
}